

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_bind(runtime_type *this,token_base *a,var *b)

{
  ulong uVar1;
  proxy *ppVar2;
  char *__s1;
  _Map_pointer ppaVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined *puVar5;
  token_base **pptVar6;
  bool *pbVar7;
  runtime_error *prVar8;
  slot_type *in_RCX;
  long lVar9;
  long lVar10;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *a_00;
  ulong uVar11;
  ulong uVar12;
  undefined1 local_88 [32];
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_68;
  token_base *local_60;
  undefined1 local_58 [32];
  
  ppVar2 = (proxy *)(in_RCX->value).first._M_dataplus._M_p;
  local_60 = a;
  if (ppVar2 == (proxy *)0x0) {
    puVar5 = &void::typeinfo;
  }
  else {
    iVar4 = (*ppVar2->data->_vptr_baseHolder[2])();
    puVar5 = (undefined *)CONCAT44(extraout_var,iVar4);
  }
  __s1 = *(char **)(puVar5 + 8);
  if ((__s1 != "St5dequeIN7cs_impl3anyESaIS1_EE") &&
     ((*__s1 == '*' || (iVar4 = strcmp(__s1,"St5dequeIN7cs_impl3anyESaIS1_EE"), iVar4 != 0)))) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Only support structured binding with array.","");
    runtime_error::runtime_error(prVar8,(string *)local_88);
    __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_58._8_8_ = in_RCX;
  local_58._16_8_ = this;
  local_68 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                       ((any *)&in_RCX->value);
  ppaVar3 = (local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (((long)b[6].mDat - (long)b[4].mDat >> 3) + ((long)b[8].mDat - (long)b[9].mDat >> 3) +
      ((((ulong)((long)b[0xb].mDat - (long)b[7].mDat) >> 3) - 1) +
      (ulong)(b[0xb].mDat == (proxy *)0x0)) * 0x40 !=
      ((long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last -
       (long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)ppaVar3 -
                (long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppaVar3 == (_Map_pointer)0x0)) * 0x40) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Unmatched structured binding.","");
    runtime_error::runtime_error(prVar8,(string *)local_88);
    __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  lVar10 = 0;
  uVar12 = 0;
  while( true ) {
    ppVar2 = b[4].mDat;
    if (((long)b[6].mDat - (long)ppVar2 >> 3) + ((long)b[8].mDat - (long)b[9].mDat >> 3) +
        ((((ulong)((long)b[0xb].mDat - (long)b[7].mDat) >> 3) - 1) +
        (ulong)(b[0xb].mDat == (proxy *)0x0)) * 0x40 <= uVar12) break;
    lVar9 = (long)ppVar2 - (long)b[5].mDat >> 3;
    uVar1 = uVar12 + lVar9;
    if (uVar1 < 0x40) {
      pbVar7 = &ppVar2->is_rvalue + lVar10;
    }
    else {
      uVar11 = uVar1 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar1) {
        uVar11 = uVar1 >> 6;
      }
      pbVar7 = (bool *)((lVar9 + uVar11 * -0x40 + uVar12) * 8 +
                       *(long *)(&(b[7].mDat)->is_rvalue + uVar11 * 8));
    }
    local_88._0_8_ = *(undefined8 *)pbVar7;
    pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
    iVar4 = (*(*pptVar6)->_vptr_token_base[2])();
    if (iVar4 == 0xf) {
      lVar9 = (long)b[4].mDat - (long)b[5].mDat >> 3;
      uVar1 = uVar12 + lVar9;
      if (uVar1 < 0x40) {
        pbVar7 = &(b[4].mDat)->is_rvalue + lVar10;
      }
      else {
        uVar11 = uVar1 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar1) {
          uVar11 = uVar1 >> 6;
        }
        pbVar7 = (bool *)((lVar9 + uVar11 * -0x40 + uVar12) * 8 +
                         *(long *)(&(b[7].mDat)->is_rvalue + uVar11 * 8));
      }
      local_88._0_8_ = *(undefined8 *)pbVar7;
      pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
      parse_bind((runtime_type *)&stack0xffffffffffffffc8,local_60,(var *)*pptVar6);
      cs_impl::any::recycle((any *)&stack0xffffffffffffffc8);
    }
    else {
      lVar9 = (long)b[4].mDat - (long)b[5].mDat >> 3;
      uVar1 = uVar12 + lVar9;
      if (uVar1 < 0x40) {
        pbVar7 = &(b[4].mDat)->is_rvalue + lVar10;
      }
      else {
        uVar11 = uVar1 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar1) {
          uVar11 = uVar1 >> 6;
        }
        pbVar7 = (bool *)((lVar9 + uVar11 * -0x40 + uVar12) * 8 +
                         *(long *)(&(b[7].mDat)->is_rvalue + uVar11 * 8));
      }
      local_88._0_8_ = *(undefined8 *)pbVar7;
      parse_expr((runtime_type *)local_58,(iterator *)local_60,SUB81(local_88,0));
      uVar1 = uVar12 + ((long)(local_68->
                              super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                              _M_impl.super__Deque_impl_data._M_start._M_cur -
                        (long)(local_68->
                              super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                              _M_impl.super__Deque_impl_data._M_start._M_first >> 3);
      a_00 = local_68;
      if (0x3f < uVar1) {
        a_00 = (deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)(uVar1 >> 6);
      }
      parse_asi((runtime_type *)(local_58 + 0x18),(var *)a_00,(var *)local_58);
      cs_impl::any::recycle((any *)(local_58 + 0x18));
      cs_impl::any::recycle((any *)local_58);
    }
    uVar12 = uVar12 + 1;
    lVar10 = lVar10 + 8;
  }
  ppVar2 = (proxy *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_58._8_8_)->_M_dataplus)._M_p;
  if (ppVar2 != (proxy *)0x0) {
    ppVar2->refcount = ppVar2->refcount + 1;
  }
  (((map_t<std::string,_callable> *)local_58._16_8_)->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = (ctrl_t *)ppVar2;
  return (var)(proxy *)local_58._16_8_;
}

Assistant:

var runtime_type::parse_bind(token_base *a, const var &b)
	{
		if (b.type() != typeid(array))
			throw runtime_error("Only support structured binding with array.");
		auto &pl = static_cast<token_parallel *>(a)->get_parallel();
		auto &arr = b.const_val<array>();
		if (pl.size() != arr.size())
			throw runtime_error("Unmatched structured binding.");
		for (std::size_t i = 0; i < pl.size(); ++i) {
			if (pl[i].root().data()->get_type() == token_types::parallel)
				parse_bind(pl[i].root().data(), arr[i]);
			else
				parse_asi(parse_expr(pl[i].root()), arr[i]);
		}
		return b;
	}